

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Option::get_flag_value
          (string *__return_storage_ptr__,Option *this,string *name,string *input_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer ppVar4;
  size_t sVar5;
  undefined8 uVar6;
  int iVar7;
  ptrdiff_t pVar8;
  int *piVar9;
  int64_t iVar10;
  string *psVar11;
  ArgumentMismatch *pAVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  size_type sVar14;
  _Alloc_hider _Var15;
  string local_100;
  string local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_ ==
       '\0') &&
     (iVar7 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::trueString_abi_cxx11_), iVar7 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::trueString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   trueString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                trueString_abi_cxx11_,"true","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         trueString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_ ==
       '\0') &&
     (iVar7 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::falseString_abi_cxx11_), iVar7 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::falseString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   falseString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                falseString_abi_cxx11_,"false","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         falseString_abi_cxx11_);
  }
  if ((get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_ ==
       '\0') &&
     (iVar7 = __cxa_guard_acquire(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)
                                   ::emptyString_abi_cxx11_), iVar7 != 0)) {
    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::emptyString_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   emptyString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_,"{}","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                  emptyString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                         emptyString_abi_cxx11_);
  }
  if ((((this->super_OptionBase<CLI::Option>).disable_flag_override_ == true) &&
      (sVar2 = input_value->_M_string_length, sVar2 != 0)) &&
     ((sVar2 != get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_._M_string_length ||
      (iVar7 = bcmp((input_value->_M_dataplus)._M_p,
                    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    emptyString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar7 != 0)))) {
    pcVar3 = (name->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar3,pcVar3 + name->_M_string_length);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a8,&this->fnames_);
    pVar8 = detail::find_member(&local_e0,&local_a8,
                                (this->super_OptionBase<CLI::Option>).ignore_case_,
                                (this->super_OptionBase<CLI::Option>).ignore_underscore_);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (pVar8 < 0) {
      sVar2 = input_value->_M_string_length;
      if ((sVar2 != get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    trueString_abi_cxx11_._M_string_length) ||
         ((sVar2 != 0 &&
          (iVar7 = bcmp((input_value->_M_dataplus)._M_p,
                        get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                        trueString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar7 != 0)))) {
        pAVar12 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar3 = (name->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + name->_M_string_length);
        CLI::ArgumentMismatch::FlagOverride(pAVar12,&local_90);
        __cxa_throw(pAVar12,&CLI::ArgumentMismatch::typeinfo,Error::~Error);
      }
    }
    else {
      ppVar4 = (this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar2 = ppVar4[pVar8].second._M_string_length;
      sVar5 = input_value->_M_string_length;
      if ((sVar2 != sVar5) ||
         ((sVar2 != 0 &&
          (iVar7 = bcmp(ppVar4[pVar8].second._M_dataplus._M_p,(input_value->_M_dataplus)._M_p,sVar2)
          , iVar7 != 0)))) {
        if ((sVar5 != (this->default_str_)._M_string_length) ||
           (((sVar5 != 0 &&
             (iVar7 = bcmp((input_value->_M_dataplus)._M_p,(this->default_str_)._M_dataplus._M_p,
                           sVar5), iVar7 != 0)) || (this->force_callback_ != true)))) {
          pAVar12 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar3 = (name->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + name->_M_string_length);
          CLI::ArgumentMismatch::FlagOverride(pAVar12,&local_70);
          __cxa_throw(pAVar12,&CLI::ArgumentMismatch::typeinfo,Error::~Error);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar3 = (input_value->_M_dataplus)._M_p;
        paVar1 = &input_value->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar1) {
          uVar6 = *(undefined8 *)((long)&input_value->field_2 + 8);
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = sVar5;
        goto LAB_00235016;
      }
    }
  }
  pcVar3 = (name->_M_dataplus)._M_p;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar3,pcVar3 + name->_M_string_length);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c0,&this->fnames_);
  pVar8 = detail::find_member(&local_100,&local_c0,
                              (this->super_OptionBase<CLI::Option>).ignore_case_,
                              (this->super_OptionBase<CLI::Option>).ignore_underscore_);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  sVar2 = input_value->_M_string_length;
  if ((sVar2 != 0) &&
     ((sVar2 != get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                emptyString_abi_cxx11_._M_string_length ||
      (iVar7 = bcmp((input_value->_M_dataplus)._M_p,
                    get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    emptyString_abi_cxx11_._M_dataplus._M_p,sVar2), iVar7 != 0)))) {
    if (-1 < pVar8) {
      ppVar4 = (this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar5 = ppVar4[pVar8].second._M_string_length;
      if ((sVar5 == get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                    falseString_abi_cxx11_._M_string_length) &&
         ((sVar5 == 0 ||
          (iVar7 = bcmp(ppVar4[pVar8].second._M_dataplus._M_p,
                        get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                        falseString_abi_cxx11_._M_dataplus._M_p,sVar5), iVar7 == 0)))) {
        piVar9 = __errno_location();
        *piVar9 = 0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar3 = (input_value->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
        iVar10 = detail::to_flag_value(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (*piVar9 != 0) {
          *piVar9 = 0;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar3 = (input_value->_M_dataplus)._M_p;
          paVar1 = &input_value->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 == paVar1) {
            uVar6 = *(undefined8 *)((long)&input_value->field_2 + 8);
            (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
          }
          __return_storage_ptr__->_M_string_length = input_value->_M_string_length;
          goto LAB_00235016;
        }
        if (iVar10 != -1) {
          if (iVar10 != 1) {
            std::__cxx11::to_string(__return_storage_ptr__,-iVar10);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          sVar14 = get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   falseString_abi_cxx11_._M_string_length;
          _Var15 = get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   falseString_abi_cxx11_._M_dataplus;
          goto LAB_00234f41;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar11 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
                   trueString_abi_cxx11_;
        goto LAB_00234f3a;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (input_value->_M_dataplus)._M_p;
    paVar1 = &input_value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar6 = *(undefined8 *)((long)&input_value->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = sVar2;
LAB_00235016:
    (input_value->_M_dataplus)._M_p = (pointer)&input_value->field_2;
    input_value->_M_string_length = 0;
    (input_value->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if (this->flag_like_ != true) {
    pbVar13 = &(this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pVar8].second;
    if (pVar8 < 0) {
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &this->default_str_;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var15._M_p = (((string *)pbVar13)->_M_dataplus)._M_p;
    sVar14 = ((string *)pbVar13)->_M_string_length;
    goto LAB_00234f41;
  }
  if (pVar8 < 0) {
    psVar11 = &get_flag_value(std::__cxx11::string_const&,std::__cxx11::string)::
               trueString_abi_cxx11_;
  }
  else {
    psVar11 = (string *)
              &(this->default_flag_values_).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[pVar8].second;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
LAB_00234f3a:
  _Var15._M_p = (psVar11->_M_dataplus)._M_p;
  sVar14 = psVar11->_M_string_length;
LAB_00234f41:
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,_Var15._M_p,_Var15._M_p + sVar14);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_flag_value(const std::string &name,
                                                                std::string input_value) const {
    static const std::string trueString{"true"};
    static const std::string falseString{"false"};
    static const std::string emptyString{"{}"};
    // check for disable flag override_
    if(disable_flag_override_) {
        if(!((input_value.empty()) || (input_value == emptyString))) {
            auto default_ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
            if(default_ind >= 0) {
                // We can static cast this to std::size_t because it is more than 0 in this block
                if(default_flag_values_[static_cast<std::size_t>(default_ind)].second != input_value) {
                    if(input_value == default_str_ && force_callback_) {
                        return input_value;
                    }
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            } else {
                if(input_value != trueString) {
                    throw(ArgumentMismatch::FlagOverride(name));
                }
            }
        }
    }
    auto ind = detail::find_member(name, fnames_, ignore_case_, ignore_underscore_);
    if((input_value.empty()) || (input_value == emptyString)) {
        if(flag_like_) {
            return (ind < 0) ? trueString : default_flag_values_[static_cast<std::size_t>(ind)].second;
        }
        return (ind < 0) ? default_str_ : default_flag_values_[static_cast<std::size_t>(ind)].second;
    }
    if(ind < 0) {
        return input_value;
    }
    if(default_flag_values_[static_cast<std::size_t>(ind)].second == falseString) {
        errno = 0;
        auto val = detail::to_flag_value(input_value);
        if(errno != 0) {
            errno = 0;
            return input_value;
        }
        return (val == 1) ? falseString : (val == (-1) ? trueString : std::to_string(-val));
    }
    return input_value;
}